

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_GetNumRhsEvals(ARKodeMem ark_mem,int partition_index,long *rhs_evals)

{
  long *in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  long lVar1;
  int local_4;
  
  lVar1 = 0;
  local_4 = mriStep_AccessStepMem
                      ((ARKodeMem)0x0,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (in_RDX == (long *)0x0) {
      arkProcessError(in_RDI,-0x16,0x93,"mriStep_GetNumRhsEvals",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"rhs_evals is NULL");
      local_4 = -0x16;
    }
    else if (in_ESI < 2) {
      if (in_ESI == 0) {
        *in_RDX = *(long *)(lVar1 + 0x198);
      }
      else if (in_ESI == 1) {
        *in_RDX = *(long *)(lVar1 + 0x1a0);
      }
      else {
        *in_RDX = *(long *)(lVar1 + 0x198) + *(long *)(lVar1 + 0x1a0);
      }
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x16,0x9a,"mriStep_GetNumRhsEvals",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"Invalid partition index");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int mriStep_GetNumRhsEvals(ARKodeMem ark_mem, int partition_index,
                           long int* rhs_evals)
{
  ARKodeMRIStepMem step_mem = NULL;

  /* access ARKodeMRIStepMem structure */
  int retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (rhs_evals == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "rhs_evals is NULL");
    return ARK_ILL_INPUT;
  }

  if (partition_index > 1)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid partition index");
    return ARK_ILL_INPUT;
  }

  switch (partition_index)
  {
  case 0: *rhs_evals = step_mem->nfse; break;
  case 1: *rhs_evals = step_mem->nfsi; break;
  default: *rhs_evals = step_mem->nfse + step_mem->nfsi; break;
  }

  return ARK_SUCCESS;
}